

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsanchorlayout_p.cpp
# Opt level: O2

void __thiscall
QGraphicsAnchorLayoutPrivate::removeAnchor
          (QGraphicsAnchorLayoutPrivate *this,AnchorVertex *firstVertex,AnchorVertex *secondVertex)

{
  QGraphicsLayoutItem *pQVar1;
  QGraphicsLayoutItem *pQVar2;
  QGraphicsLayoutItem *pQVar3;
  ulong uVar4;
  int i_1;
  int i;
  AnchorPoint AVar5;
  long in_FS_OFFSET;
  bool bVar6;
  bool bVar7;
  pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int> pVar8;
  QGraphicsLayoutItem *secondItem;
  QGraphicsLayoutItem *firstItem;
  QGraphicsLayoutItem *local_58;
  QGraphicsLayoutItem *local_50;
  pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint> local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->super_QGraphicsLayoutPrivate).super_QGraphicsLayoutItemPrivate.q_ptr;
  pQVar2 = firstVertex->m_item;
  pQVar3 = secondVertex->m_item;
  local_58 = pQVar3;
  local_50 = pQVar2;
  removeAnchor_helper(this,firstVertex,secondVertex);
  bVar7 = true;
  bVar6 = true;
  if (pQVar2 != pQVar1) {
    for (AVar5 = AnchorLeft; bVar6 = AVar5 != (AnchorVerticalCenter|AnchorRight), bVar6;
        AVar5 = AVar5 + AnchorHorizontalCenter) {
      local_48.first = pQVar2;
      local_48.second = AVar5;
      pVar8 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
              ::value(&this->m_vertexList,&local_48);
      if ((pVar8.first != (AnchorVertex *)0x0) &&
         ((int)((AVar5 == AnchorHorizontalCenter || AVar5 == AnchorVerticalCenter) + 1) <
          pVar8.second)) break;
    }
  }
  if (pQVar3 != pQVar1) {
    for (AVar5 = AnchorLeft; bVar7 = AVar5 != (AnchorVerticalCenter|AnchorRight), bVar7;
        AVar5 = AVar5 + AnchorHorizontalCenter) {
      local_48.first = pQVar3;
      local_48.second = AVar5;
      pVar8 = QHash<std::pair<QGraphicsLayoutItem_*,_Qt::AnchorPoint>,_std::pair<QtGraphicsAnchorLayout::AnchorVertex_*,_int>_>
              ::value(&this->m_vertexList,&local_48);
      if ((pVar8.first != (AnchorVertex *)0x0) &&
         ((int)((AVar5 == AnchorHorizontalCenter || AVar5 == AnchorVerticalCenter) + 1) <
          pVar8.second)) break;
    }
  }
  if (!bVar6) {
    uVar4 = QtPrivate::indexOf<QGraphicsLayoutItem*,QGraphicsLayoutItem*>(&this->items,&local_50,0);
    (*pQVar1->_vptr_QGraphicsLayoutItem[0xb])(pQVar1,uVar4 & 0xffffffff);
  }
  if (!bVar7) {
    uVar4 = QtPrivate::indexOf<QGraphicsLayoutItem*,QGraphicsLayoutItem*>(&this->items,&local_58,0);
    (*pQVar1->_vptr_QGraphicsLayoutItem[0xb])(pQVar1,uVar4 & 0xffffffff);
  }
  (*pQVar1->_vptr_QGraphicsLayoutItem[7])();
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsAnchorLayoutPrivate::removeAnchor(AnchorVertex *firstVertex,
                                                AnchorVertex *secondVertex)
{
    Q_Q(QGraphicsAnchorLayout);

    // Save references to items while it's safe to assume the vertices exist
    QGraphicsLayoutItem *firstItem = firstVertex->m_item;
    QGraphicsLayoutItem *secondItem = secondVertex->m_item;

    // Delete the anchor (may trigger deletion of center vertices)
    removeAnchor_helper(firstVertex, secondVertex);

    // Ensure no dangling pointer is left behind
    firstVertex = secondVertex = nullptr;

    // Checking if the item stays in the layout or not
    bool keepFirstItem = false;
    bool keepSecondItem = false;

    std::pair<AnchorVertex *, int> v;
    int refcount = -1;

    if (firstItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(firstItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepFirstItem = true;
                    break;
                }
            }
        }
    } else
        keepFirstItem = true;

    if (secondItem != q) {
        for (int i = Qt::AnchorLeft; i <= Qt::AnchorBottom; ++i) {
            v = m_vertexList.value(std::pair(secondItem, static_cast<Qt::AnchorPoint>(i)));
            if (v.first) {
                if (i == Qt::AnchorHorizontalCenter || i == Qt::AnchorVerticalCenter)
                    refcount = 2;
                else
                    refcount = 1;

                if (v.second > refcount) {
                    keepSecondItem = true;
                    break;
                }
            }
        }
    } else
        keepSecondItem = true;

    if (!keepFirstItem)
        q->removeAt(items.indexOf(firstItem));

    if (!keepSecondItem)
        q->removeAt(items.indexOf(secondItem));

    // Removing anchors invalidates the layout
    q->invalidate();
}